

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arranger.cpp
# Opt level: O2

void initialize_task_list
               (string *filename,string *download_address,curl_off_t file_size,
               download_status *status)

{
  ulong uVar1;
  Task *this;
  long start;
  _List_node_base *p_Var2;
  Task *one_initial_task;
  list<Task_*,_std::allocator<Task_*>_> *local_78;
  string *local_70;
  string *local_68;
  proxy local_60;
  
  uVar1 = (status->globalProxyList).super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
          _M_size * 0x600000;
  local_70 = filename;
  local_68 = download_address;
  if (uVar1 < (ulong)file_size || uVar1 - file_size == 0) {
    local_78 = &status->globalTaskList;
    p_Var2 = (_List_node_base *)&status->globalProxyList;
    while (p_Var2 = (((_List_base<proxy,_std::allocator<proxy>_> *)&p_Var2->_M_next)->_M_impl).
                    _M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)&status->globalProxyList) {
      this = (Task *)operator_new(0x68);
      proxy::proxy(&local_60,(proxy *)(p_Var2 + 1));
      start = (status->globalTaskList).super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl.
              _M_node._M_size * 0x600000;
      Task::Task(this,&local_60,start,start + 0x600000);
      std::__cxx11::string::~string((string *)&local_60);
      one_initial_task = this;
      std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::push_back(local_78,&one_initial_task);
      Task::execute(one_initial_task,local_70,local_68,&status->taskMessageQueue);
    }
    return;
  }
  fwrite("file size too small, please decrease proxies.",0x2d,1,_stderr);
  exit(-1);
}

Assistant:

void
initialize_task_list(const string &filename, const string &download_address, curl_off_t file_size, download_status *status) {
    if (TEST_DOWNLOAD_BYTES * status->globalProxyList.size() > file_size) {
        fprintf(stderr, "file size too small, please decrease proxies.");
        exit(-1);
    }
    for (const proxy &single_proxy:status->globalProxyList) {
        Task *one_initial_task = new Task(single_proxy, status->globalTaskList.size() * TEST_DOWNLOAD_BYTES,
                                          (status->globalTaskList.size() + 1) * TEST_DOWNLOAD_BYTES);
        status->globalTaskList.push_back(one_initial_task);
        one_initial_task->execute(filename, download_address, &status->taskMessageQueue);
    }
}